

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
DrawTestCase(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this,
            TestContext *context,char *name,char *desc,DrawIndirectParams *data)

{
  DrawIndirectParams *__s;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  DrawIndirectParams *local_30;
  DrawIndirectParams *data_local;
  char *desc_local;
  char *name_local;
  TestContext *context_local;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this_local;
  
  local_30 = data;
  data_local = (DrawIndirectParams *)desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  __s = data_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,(char *)__s,&local_89);
  TestCase::TestCase(&this->super_TestCase,context,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawTestCase_016ae480;
  DrawIndirectParams::DrawIndirectParams(&this->m_data,data);
  std::__cxx11::string::string((string *)&this->m_vertShaderSource);
  std::__cxx11::string::string((string *)&this->m_fragShaderSource);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])();
  return;
}

Assistant:

DrawTestCase<T>::DrawTestCase (tcu::TestContext& context, const char* name, const char* desc, const T data)
	: vkt::TestCase	(context, name, desc)
	, m_data		(data)
{
	initShaderSources();
}